

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicLoad<unsigned_long,unsigned_long>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  pointer puVar1;
  Store *this_00;
  RunResult RVar2;
  Value value;
  Value VVar3;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar3 = Pop(this);
  if ((instr.field_2.imm_u32x2.snd + VVar3.i32_ & 7) == 0) {
    value._8_8_ = VVar3.i64_ & 0xffffffff;
    puVar1 = ((local_80.obj_)->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (value._8_8_ + instr.field_2.imm_u32x2.snd + 8 <=
        (ulong)((long)((local_80.obj_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1)) {
      value.i64_ = *(undefined8 *)(puVar1 + instr.field_2.imm_u32x2.snd + value._8_8_);
      Push(this,value);
      RVar2 = Ok;
      goto LAB_001a2cda;
    }
  }
  this_00 = this->store_;
  StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %u+%u",VVar3.i64_ & 0xffffffff);
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            (&local_48,this_00,this_00,&local_68,&this->frames_);
  out_trap->obj_ = local_48.obj_;
  out_trap->store_ = local_48.store_;
  out_trap->root_index_ = local_48.root_index_;
  local_48.obj_ = (Trap *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  RVar2 = Trap;
LAB_001a2cda:
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoAtomicLoad(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u32 offset = Pop<u32>();
  V val;
  TRAP_IF(Failed(memory->AtomicLoad(offset, instr.imm_u32x2.snd, &val)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(val));
  return RunResult::Ok;
}